

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void __thiscall Bitmap::duplicateLineDown(Bitmap *this,uint32_t y,uint32_t times)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  byte bVar7;
  uint32_t x;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  
  if (this->orientation == Horizontally) {
    if (times != 0) {
      iVar11 = y * this->widthByte;
      uVar6 = 1;
      while( true ) {
        uVar3 = this->lengthByte;
        iVar12 = this->widthByte * uVar6 + iVar11;
        uVar9 = this->widthByte + iVar12;
        if (uVar3 < uVar9) break;
        if (this->widthByte != 0) {
          uVar10 = 0;
          do {
            this->data[(uint)(iVar12 + (int)uVar10)] = this->data[(uint)(iVar11 + (int)uVar10)];
            uVar10 = uVar10 + 1;
          } while (uVar10 < this->widthByte);
        }
        if (uVar3 < uVar9) {
          return;
        }
        uVar6 = uVar6 + 1;
        if (times < uVar6) {
          return;
        }
      }
    }
  }
  else {
    uVar2 = this->height;
    if (uVar2 != 0) {
      uVar6 = 2;
      if (2 < times + 1) {
        uVar6 = times + 1;
      }
      x = 0;
      do {
        uVar3 = getPixelIndex(this,x,y);
        uVar9 = 0;
        if (uVar3 < (uint)this->length) {
          uVar9 = uVar3 + 7;
          if (-1 < (int)uVar3) {
            uVar9 = uVar3;
          }
          uVar9 = (uint)this->data[(int)uVar9 >> 3];
        }
        if (times != 0) {
          iVar11 = y + 1;
          iVar12 = uVar6 - 1;
          do {
            uVar4 = getPixelIndex(this,x,iVar11);
            if (uVar4 < (uint)this->length) {
              bVar5 = (byte)uVar4 & 7;
              uVar8 = uVar4 + 7;
              if (-1 < (int)uVar4) {
                uVar8 = uVar4;
              }
              bVar1 = this->data[(int)uVar8 >> 3];
              bVar7 = (byte)(0x80 >> bVar5) | bVar1;
              if ((uVar9 & 0x80U >> ((byte)uVar3 & 7)) == 0) {
                bVar7 = (byte)(-0x81 >> bVar5) & bVar1;
              }
              this->data[(int)uVar8 >> 3] = bVar7;
            }
            iVar11 = iVar11 + 1;
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        x = x + 1;
      } while (x != uVar2);
    }
  }
  return;
}

Assistant:

void Bitmap::duplicateLineDown(const uint32_t y, const uint32_t times)
{
#if 1
   if (orientation == Orientation::Horizontally)
   {
      //for horizontal orientation, this operation can be done very efficient just coping bytes
      uint32_t origin = y * this->widthByte;
      for (uint32_t i = 1; i <= times; ++i)
      {
         uint32_t line = i*this->widthByte + origin;
         if (line + this->widthByte <= this->lengthByte) //preven buffer overflow
         {
            for (uint32_t j = 0; j < this->widthByte; ++j)
            {
               this->data[line + j] = this->data[origin + j];
            }
            continue;
         }
         break;
      }
   }
   else //Vertically
#endif
   {
      //for vertical orientation, this must be done plain... (pixel by pixel)
      uint32_t xend = (orientation == Orientation::Horizontally) ? this->width : this->height; //but can also be done for horizontal orientation
      for (uint32_t x = 0; x < xend; ++x)
      {
         uint32_t sourcePixel = getPixelIndex(x, y);
         bool value = getPixelValue(sourcePixel);
         for (uint32_t i = 1; i <= times; ++i)
         {
            uint32_t destinationPixel = getPixelIndex(x, y+i);
            setPixelValue(destinationPixel, value);
         }
      }
   }
}